

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalExpressionGet::Deserialize(LogicalExpressionGet *this,Deserializer *deserializer)

{
  unsigned_long table_index;
  LogicalExpressionGet *this_00;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_true>
  expressions;
  vector<duckdb::LogicalType,_true> expr_types;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  local_98;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  local_58;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  
  table_index = Deserializer::ReadPropertyWithDefault<unsigned_long>(deserializer,200,"table_index")
  ;
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_78,deserializer,0xc9,"expr_types");
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,true>>
            ((vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_true>
              *)&local_98,deserializer,0xca,"expressions");
  this_00 = (LogicalExpressionGet *)operator_new(0xa0);
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_98.
       super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_58.
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_98.
       super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98.
       super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalExpressionGet
            (this_00,table_index,(vector<duckdb::LogicalType,_true> *)&local_38,
             (vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_true>
              *)&local_58);
  ::std::
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ::~vector(&local_58);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  ::std::
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
  ::~vector(&local_98);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalExpressionGet::Deserialize(Deserializer &deserializer) {
	auto table_index = deserializer.ReadPropertyWithDefault<idx_t>(200, "table_index");
	auto expr_types = deserializer.ReadPropertyWithDefault<vector<LogicalType>>(201, "expr_types");
	auto expressions = deserializer.ReadPropertyWithDefault<vector<vector<unique_ptr<Expression>>>>(202, "expressions");
	auto result = duckdb::unique_ptr<LogicalExpressionGet>(new LogicalExpressionGet(table_index, std::move(expr_types), std::move(expressions)));
	return std::move(result);
}